

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcLoad.c
# Opt level: O2

void Bmc_LoadTest(Gia_Man_t *pGia,int fLoadCnf,int fVerbose)

{
  sat_solver *psVar1;
  int iVar2;
  uint uVar3;
  Bmc_Load_t *p;
  Gia_Obj_t *pObj;
  abctime aVar4;
  char *__format;
  long lVar5;
  uint i;
  int local_3c;
  abctime local_38;
  
  local_38 = Abc_Clock();
  p = Bmc_LoadStart(pGia);
  if (fLoadCnf != 0) {
    psVar1 = p->pSat;
    psVar1->pCnfMan = p;
    psVar1->pCnfFunc = Bmc_LoadAddCnf;
  }
  for (i = 0; (int)i < pGia->vCos->nSize - pGia->nRegs; i = i + 1) {
    iVar2 = Vec_IntEntry(pGia->vCos,i);
    pObj = Gia_ManObj(pGia,iVar2);
    if (pObj == (Gia_Obj_t *)0x0) break;
    iVar2 = Gia_ObjFaninId0p(pGia,pObj);
    if (fLoadCnf == 0) {
      iVar2 = Bmc_LoadAddCnf_rec(p,iVar2);
    }
    else {
      iVar2 = Bmc_LoadGetSatVar(p,iVar2);
    }
    local_3c = Abc_Var2Lit(iVar2,*(uint *)pObj >> 0x1d & 1);
    if (fVerbose != 0) {
      printf("Frame%4d :  ",(ulong)i);
      printf("Vars = %6d  ",(ulong)(uint)p->vSat2Id->nSize);
      uVar3 = sat_solver_nclauses(p->pSat);
      printf("Clas = %6d  ",(ulong)uVar3);
    }
    iVar2 = sat_solver_solve(p->pSat,&local_3c,(lit *)&local_38,0,0,0,0);
    if (fVerbose != 0) {
      uVar3 = sat_solver_nconflicts(p->pSat);
      printf("Conf = %6d  ",(ulong)uVar3);
      __format = "UNDEC  ";
      if (iVar2 == 1) {
        __format = "SAT    ";
      }
      if (iVar2 == -1) {
        __format = "UNSAT  ";
      }
      printf(__format);
      iVar2 = (int)__format;
      aVar4 = Abc_Clock();
      lVar5 = aVar4 - local_38;
      Abc_Print(iVar2,"%s =","Time");
      Abc_Print(iVar2,"%9.2f sec\n",(double)lVar5 / 1000000.0);
    }
  }
  printf("Callbacks = %d.  Loadings = %d.\n",(ulong)(uint)p->nCallBacks1,(ulong)(uint)p->nCallBacks2
        );
  Bmc_LoadStop(p);
  return;
}

Assistant:

void Bmc_LoadTest( Gia_Man_t * pGia, int fLoadCnf, int fVerbose )
{
    int nConfLimit = 0;
    Bmc_Load_t * p;
    Gia_Obj_t * pObj;
    int i, status, Lit;
    abctime clk = Abc_Clock();
    // create the loading manager
    p = Bmc_LoadStart( pGia );
    // add callback for CNF loading
    if ( fLoadCnf )
    {
        p->pSat->pCnfMan  = p;
        p->pSat->pCnfFunc = Bmc_LoadAddCnf;
    }
    // solve SAT problem for each PO
    Gia_ManForEachPo( pGia, pObj, i )
    {
        if ( fLoadCnf )
            Lit = Abc_Var2Lit( Bmc_LoadGetSatVar(p, Gia_ObjFaninId0p(pGia, pObj)), Gia_ObjFaninC0(pObj) );
        else
            Lit = Abc_Var2Lit( Bmc_LoadAddCnf_rec(p, Gia_ObjFaninId0p(pGia, pObj)), Gia_ObjFaninC0(pObj) );
        if ( fVerbose )
        {
            printf( "Frame%4d :  ", i );
            printf( "Vars = %6d  ", Vec_IntSize(p->vSat2Id) );
            printf( "Clas = %6d  ", sat_solver_nclauses(p->pSat) );
        }
        status = sat_solver_solve( p->pSat, &Lit, &Lit + 1, (ABC_INT64_T)nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        if ( fVerbose )
        {
            printf( "Conf = %6d  ", sat_solver_nconflicts(p->pSat) );
            if ( status == l_False )
                printf( "UNSAT  " );
            else if ( status == l_True )
                printf( "SAT    " );
            else // if ( status == l_Undec )
                printf( "UNDEC  " );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        }
    }
    printf( "Callbacks = %d.  Loadings = %d.\n", p->nCallBacks1, p->nCallBacks2 );
    Bmc_LoadStop( p );
}